

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O2

char * leveldb::GetVarint32Ptr(char *p,char *limit,uint32_t *value)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  if ((p < limit) && (-1 < *p)) {
    *value = (int)*p;
    return p + 1;
  }
  uVar3 = 0;
  uVar2 = 0;
  while( true ) {
    if (0x1c < uVar2) {
      return (char *)0x0;
    }
    if (limit <= p) break;
    bVar1 = *p;
    if (-1 < (char)bVar1) {
      *value = (uint)bVar1 << ((byte)uVar2 & 0x1f) | uVar3;
      return (char *)((byte *)p + 1);
    }
    p = (char *)((byte *)p + 1);
    uVar3 = uVar3 | (bVar1 & 0x7f) << ((byte)uVar2 & 0x1f);
    uVar2 = uVar2 + 7;
  }
  return (char *)0x0;
}

Assistant:

inline const char* GetVarint32Ptr(const char* p, const char* limit,
                                  uint32_t* value) {
  if (p < limit) {
    uint32_t result = *(reinterpret_cast<const unsigned char*>(p));
    if ((result & 128) == 0) {
      *value = result;
      return p + 1;
    }
  }
  return GetVarint32PtrFallback(p, limit, value);
}